

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

void __thiscall
vkt::rasterization::anon_unknown_0::PointTestInstance::generatePoints
          (PointTestInstance *this,int iteration,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData,
          vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *outPoints)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  ostringstream *poVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  pointer pVVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  pointer pSVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined4 extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined1 local_1b0 [384];
  
  uVar15 = (ulong)(uint)iteration;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(outData,6);
  if ((uint)iteration < 3) {
    fVar4 = *(float *)(&DAT_00b226f0 + uVar15 * 4);
    fVar5 = *(float *)(&DAT_00b226fc + uVar15 * 4);
    fVar6 = *(float *)(&DAT_00b22708 + uVar15 * 4);
    fVar7 = *(float *)(&DAT_00b22714 + uVar15 * 4);
    fVar8 = *(float *)(&DAT_00b22720 + uVar15 * 4);
    fVar9 = *(float *)(&DAT_00b2272c + uVar15 * 4);
    fVar10 = *(float *)(&DAT_00b22738 + uVar15 * 4);
    fVar11 = *(float *)(&DAT_00b22744 + uVar15 * 4);
    fVar12 = *(float *)(&DAT_00b22750 + uVar15 * 4);
    fVar13 = *(float *)(&DAT_00b2275c + uVar15 * 4);
    pVVar14 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14->m_data[0] = *(float *)(&DAT_00b226e4 + uVar15 * 4);
    pVVar14->m_data[1] = fVar4;
    pVVar14->m_data[2] = 0.0;
    pVVar14->m_data[3] = 1.0;
    pVVar14 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14[1].m_data[0] = fVar5;
    pVVar14[1].m_data[1] = fVar6;
    pVVar14[1].m_data[2] = 0.0;
    pVVar14[1].m_data[3] = 1.0;
    pVVar14 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14[2].m_data[0] = fVar7;
    pVVar14[2].m_data[1] = fVar8;
    pVVar14[2].m_data[2] = 0.0;
    pVVar14[2].m_data[3] = 1.0;
    pVVar14 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14[3].m_data[0] = fVar9;
    pVVar14[3].m_data[1] = 0.2;
    pVVar14[3].m_data[2] = 0.0;
    pVVar14[3].m_data[3] = 1.0;
    pVVar14 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14[4].m_data[0] = fVar10;
    pVVar14[4].m_data[1] = fVar11;
    pVVar14[4].m_data[2] = 0.0;
    pVVar14[4].m_data[3] = 1.0;
    pVVar14 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14[5].m_data[0] = fVar12;
    pVVar14[5].m_data[1] = fVar13;
    pVVar14[5].m_data[2] = 0.0;
    pVVar14[5].m_data[3] = 1.0;
  }
  std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
  resize(outPoints,
         (long)(outData->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(outData->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start >> 4);
  pSVar19 = (outPoints->
            super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(outPoints->
                              super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar19) >> 2) *
          0x38e38e39) {
    lVar21 = 0;
    lVar22 = 0;
    lVar20 = 0;
    do {
      puVar1 = (undefined4 *)
               ((long)((outData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar21);
      uVar16 = puVar1[1];
      uVar17 = puVar1[2];
      uVar18 = puVar1[3];
      puVar2 = (undefined4 *)((long)(pSVar19->position).m_data + lVar22);
      *puVar2 = *puVar1;
      puVar2[1] = uVar16;
      puVar2[2] = uVar17;
      puVar2[3] = uVar18;
      (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[4])(this);
      pSVar19 = (outPoints->
                super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                )._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)(&pSVar19->color + 1) + lVar22) = extraout_XMM0_Da;
      lVar20 = lVar20 + 1;
      lVar22 = lVar22 + 0x24;
      lVar21 = lVar21 + 0x10;
    } while (lVar20 < (int)((ulong)((long)(outPoints->
                                          super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pSVar19) >> 2) * 0x38e38e39);
  }
  local_1b0._0_8_ =
       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Rendering ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3," point(s): (point size = ",0x19);
  (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[4])(this);
  std::ostream::_M_insert<double>((double)extraout_XMM0_Da_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  if (0 < (int)((ulong)((long)(outPoints->
                              super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(outPoints->
                             super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39) {
    poVar3 = (ostringstream *)(local_1b0 + 8);
    lVar20 = 0;
    lVar21 = 0;
    do {
      local_1b0._0_8_ =
           ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Point ",6);
      lVar21 = lVar21 + 1;
      std::ostream::operator<<(poVar3,(int)lVar21);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,":\t",2);
      tcu::operator<<((ostream *)poVar3,
                      (Vector<float,_4> *)
                      ((long)(((outPoints->
                               super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                               )._M_impl.super__Vector_impl_data._M_start)->position).m_data +
                      lVar20));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      lVar20 = lVar20 + 0x24;
    } while (lVar21 < (int)((ulong)((long)(outPoints->
                                          super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(outPoints->
                                         super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      0x38e38e39);
  }
  return;
}

Assistant:

void PointTestInstance::generatePoints (int iteration, std::vector<tcu::Vec4>& outData, std::vector<PointSceneSpec::ScenePoint>& outPoints)
{
	outData.resize(6);

	switch (iteration)
	{
		case 0:
			// \note: these values are chosen arbitrarily
			outData[0] = tcu::Vec4( 0.2f,  0.8f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4( 0.5f,  0.2f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( 0.5f,  0.3f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.5f,  0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(-0.2f, -0.4f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4(-0.4f,  0.2f, 0.0f, 1.0f);
			break;

		case 1:
			outData[0] = tcu::Vec4(-0.499f, 0.128f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(-0.501f,  -0.3f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.11f,  -0.2f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(  0.11f,   0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(  0.88f,   0.9f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4(   0.4f,   1.2f, 0.0f, 1.0f);
			break;

		case 2:
			outData[0] = tcu::Vec4( -0.9f, -0.3f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(  0.3f, -0.9f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( -0.4f, -0.1f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.11f,  0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4( 0.88f,  0.7f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4( -0.4f,  0.4f, 0.0f, 1.0f);
			break;
	}

	outPoints.resize(outData.size());
	for (int pointNdx = 0; pointNdx < (int)outPoints.size(); ++pointNdx)
	{
		outPoints[pointNdx].position = outData[pointNdx];
		outPoints[pointNdx].pointSize = getPointSize();
	}

	// log
	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Rendering " << outPoints.size() << " point(s): (point size = " << getPointSize() << ")" << tcu::TestLog::EndMessage;
	for (int pointNdx = 0; pointNdx < (int)outPoints.size(); ++pointNdx)
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Point " << (pointNdx+1) << ":\t" << outPoints[pointNdx].position << tcu::TestLog::EndMessage;
}